

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_0::BaseCase::render
          (BaseCase *this,RenderData *data,int instances)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  Functions *gl;
  int instances_local;
  RenderData *data_local;
  BaseCase *this_local;
  long lVar4;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  pcVar1 = *(code **)(lVar4 + 0x1680);
  dVar3 = glu::ShaderProgram::getProgram(&data->m_program);
  (*pcVar1)(dVar3);
  pcVar1 = *(code **)(lVar4 + 0xd8);
  dVar3 = glu::ObjectWrapper::operator*(&(data->m_vao).super_ObjectWrapper);
  (*pcVar1)(dVar3);
  (**(code **)(lVar4 + 0x548))(4,0,data->m_numVertices,instances);
  (**(code **)(lVar4 + 0xd8))(0);
  return;
}

Assistant:

void BaseCase::render (const RenderData& data, int instances) const
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	gl.useProgram(data.m_program.getProgram());

	gl.bindVertexArray(*data.m_vao);
	gl.drawArraysInstanced(GL_TRIANGLES, 0, data.m_numVertices, instances);
	gl.bindVertexArray(0);
}